

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O3

unsigned_long_long strpool_inject(strpool_t *pool,char *string,int length)

{
  char cVar1;
  uint uVar2;
  strpool_internal_entry_t *__src;
  strpool_internal_handle_t *__src_00;
  strpool_internal_block_t *psVar3;
  char *pcVar4;
  int i;
  int iVar5;
  ulong uVar6;
  strpool_internal_hash_slot_t *psVar7;
  strpool_internal_entry_t *psVar8;
  strpool_internal_handle_t *psVar9;
  unsigned_long_long uVar10;
  int iVar11;
  uint uVar12;
  char cVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  strpool_internal_hash_slot_t *__ptr;
  long lVar18;
  ulong uVar19;
  ulong __n;
  uint uVar20;
  int iVar21;
  char *data;
  uint *puVar22;
  uint uVar23;
  int local_68;
  
  if (length < 1 || string == (char *)0x0) {
    uVar10 = 0;
  }
  else {
    __n = (ulong)(uint)length;
    if (0 < (long)pool->block_count) {
      lVar14 = 0;
      do {
        lVar18 = *(long *)((long)&pool->blocks->data + lVar14);
        if (((char *)(lVar18 + 8U) <= string) &&
           (string < (char *)(lVar18 + *(int *)((long)&pool->blocks->capacity + lVar14)))) {
          if ((*(int *)(string + -4) == length) &&
             ((string[__n] == '\0' && (uVar23 = *(uint *)(string + -8), uVar23 != 0))))
          goto LAB_001446dd;
          break;
        }
        lVar14 = lVar14 + 0x20;
      } while ((long)pool->block_count * 0x20 != lVar14);
    }
    if (pool->ignore_case == 0) {
      uVar6 = 0;
      uVar23 = 0x1505;
      do {
        uVar23 = uVar23 * 0x21 ^ (int)string[uVar6];
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
    else {
      uVar23 = 0x1505;
      uVar6 = 0;
      do {
        cVar1 = string[uVar6];
        cVar13 = cVar1 + -0x20;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          cVar13 = cVar1;
        }
        uVar23 = (int)cVar13 ^ uVar23 * 0x21;
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
    uVar23 = uVar23 + (uVar23 == 0);
LAB_001446dd:
    uVar12 = pool->hash_capacity;
    uVar15 = uVar12 - 1;
    uVar17 = uVar15 & uVar23;
    __ptr = pool->hash_table;
    iVar21 = __ptr[(int)uVar17].base_count;
    uVar16 = uVar17;
    uVar20 = uVar17;
    while (0 < iVar21) {
      uVar2 = __ptr[(int)uVar16].hash_key;
      if ((uVar2 == 0) && (__ptr[(int)uVar20].hash_key != 0)) {
        uVar20 = uVar16;
      }
      if (((uVar2 & uVar15) == uVar17) && (iVar21 = iVar21 + -1, uVar2 == uVar23)) {
        iVar11 = __ptr[(int)uVar16].entry_index;
        psVar8 = pool->entries;
        if (psVar8[iVar11].length == length) {
          if (pool->ignore_case == 0) {
            iVar5 = bcmp(psVar8[iVar11].data + 8,string,__n);
          }
          else {
            iVar5 = strncasecmp(psVar8[iVar11].data + 8,string,__n);
          }
          if (iVar5 == 0) {
            local_68 = psVar8[iVar11].handle_index;
            psVar9 = pool->handles + local_68;
            goto LAB_00144c4e;
          }
        }
      }
      uVar16 = uVar16 + 1 & uVar15;
    }
    iVar11 = (int)((ulong)((long)(int)uVar12 * 0x55555555) >> 0x20) - uVar12;
    if ((int)(((iVar11 >> 1) - (iVar11 >> 0x1f)) + uVar12) <= pool->entry_count) {
      pool->hash_capacity = uVar12 * 2;
      psVar7 = (strpool_internal_hash_slot_t *)calloc(1,(long)(int)uVar12 * 0x18);
      pool->hash_table = psVar7;
      if (psVar7 == (strpool_internal_hash_slot_t *)0x0) {
        __assert_fail("( pool->hash_table ) && ( \"Allocation failed\" )",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                      ,0x346,"void strpool_internal_expand_hash_table(strpool_t *)");
      }
      if (0 < (int)uVar12) {
        uVar16 = uVar12 * 2 - 1;
        uVar6 = 0;
        do {
          uVar20 = __ptr[uVar6].hash_key;
          if (uVar20 != 0) {
            uVar17 = uVar20 & uVar16;
            lVar18 = (long)(int)uVar17;
            uVar15 = psVar7[lVar18].hash_key;
            lVar14 = lVar18;
            while (uVar15 != 0) {
              uVar17 = uVar17 + 1 & uVar16;
              lVar14 = (long)(int)uVar17;
              uVar15 = psVar7[lVar14].hash_key;
            }
            psVar7[lVar14].hash_key = uVar20;
            iVar11 = __ptr[uVar6].entry_index;
            psVar7[lVar14].entry_index = iVar11;
            pool->entries[iVar11].hash_slot = uVar17;
            psVar7[lVar18].base_count = psVar7[lVar18].base_count + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar12);
      }
      free(__ptr);
      uVar12 = pool->hash_capacity;
      uVar15 = uVar12 - 1;
      uVar17 = uVar15 & uVar23;
      __ptr = pool->hash_table;
      uVar16 = uVar17;
      uVar20 = uVar17;
      for (; iVar21 != 0; iVar21 = iVar21 - (uint)((__ptr[lVar14].hash_key & uVar15) == uVar17)) {
        lVar14 = (long)(int)uVar16;
        if ((__ptr[lVar14].hash_key == 0) && (__ptr[(int)uVar20].hash_key != 0)) {
          uVar20 = uVar16;
        }
        uVar16 = uVar16 + 1 & uVar15;
      }
    }
    lVar14 = (long)(int)uVar20;
    if (__ptr[lVar14].hash_key != 0) {
      do {
        uVar20 = uVar20 + 1 & uVar12 - 1;
        lVar14 = (long)(int)uVar20;
      } while (__ptr[lVar14].hash_key != 0);
    }
    iVar21 = pool->entry_count;
    iVar11 = pool->entry_capacity;
    if (iVar11 <= iVar21) {
      pool->entry_capacity = iVar11 * 2;
      psVar8 = (strpool_internal_entry_t *)malloc((long)iVar11 << 6);
      if (psVar8 == (strpool_internal_entry_t *)0x0) {
        __assert_fail("( new_entries ) && ( \"Allocation failed\" )",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                      ,0x363,"void strpool_internal_expand_entries(strpool_t *)");
      }
      __src = pool->entries;
      memcpy(psVar8,__src,(long)iVar21 << 5);
      free(__src);
      pool->entries = psVar8;
      __ptr = pool->hash_table;
    }
    if ((__ptr[lVar14].hash_key != 0) || ((pool->hash_capacity - 1U & uVar23) != uVar17)) {
      __assert_fail("( !pool->hash_table[ slot ].hash_key && ( hash & ( (unsigned int) pool->hash_capacity - 1 ) ) == (unsigned int) base_slot ) && ( \"Invalid slot\" )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                    ,0x3f3,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
    }
    __ptr[lVar14].hash_key = uVar23;
    iVar21 = pool->entry_count;
    __ptr[lVar14].entry_index = iVar21;
    __ptr[(int)uVar17].base_count = __ptr[(int)uVar17].base_count + 1;
    local_68 = pool->handle_count;
    lVar14 = (long)local_68;
    iVar11 = pool->handle_capacity;
    if (local_68 < iVar11) {
      psVar9 = pool->handles;
      psVar9[lVar14].counter = 1;
      pool->handle_count = local_68 + 1;
      lVar18 = lVar14;
    }
    else {
      local_68 = pool->handle_freelist_head;
      lVar18 = (long)local_68;
      if (lVar18 < 0) {
        pool->handle_capacity = iVar11 * 2;
        psVar9 = (strpool_internal_handle_t *)malloc((long)iVar11 << 4);
        if (psVar9 == (strpool_internal_handle_t *)0x0) {
          __assert_fail("( new_handles ) && ( \"Allocation failed\" )",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                        ,0x36f,"void strpool_internal_expand_handles(strpool_t *)");
        }
        __src_00 = pool->handles;
        memcpy(psVar9,__src_00,lVar14 << 3);
        free(__src_00);
        pool->handles = psVar9;
        local_68 = pool->handle_count;
        lVar18 = (long)local_68;
        psVar9[lVar18].counter = 1;
        pool->handle_count = local_68 + 1;
        iVar21 = pool->entry_count;
      }
      else {
        psVar9 = pool->handles;
        iVar11 = psVar9[lVar18].entry_index;
        if (pool->handle_freelist_tail == local_68) {
          pool->handle_freelist_tail = iVar11;
        }
        pool->handle_freelist_head = iVar11;
      }
    }
    psVar9[lVar18].entry_index = iVar21;
    psVar8 = pool->entries + iVar21;
    pool->entry_count = iVar21 + 1;
    iVar21 = length + 9;
    if (length + 9 < pool->min_data_size) {
      iVar21 = pool->min_data_size;
    }
    uVar12 = iVar21 - 1U >> 1 | iVar21 - 1U;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    uVar12 = uVar12 >> 0x10 | uVar12;
    iVar21 = uVar12 + 1 + (uint)(uVar12 == 0xffffffff);
    psVar3 = pool->blocks;
    if (0 < (long)pool->block_count) {
      lVar14 = 0;
      do {
        uVar6 = (ulong)psVar3[lVar14].free_list;
        if (-1 < (long)uVar6) {
          pcVar4 = psVar3[lVar14].data;
          iVar11 = *(int *)(pcVar4 + uVar6);
          if (iVar11 / 2 < iVar21) {
            if (iVar21 <= iVar11) {
              puVar22 = (uint *)(pcVar4 + uVar6);
              psVar3[lVar14].free_list = *(int *)(pcVar4 + uVar6 + 4);
              goto LAB_00144bf2;
            }
          }
          else {
            do {
              uVar19 = uVar6 & 0xffffffff;
              uVar6 = (ulong)*(int *)(pcVar4 + uVar6 + 4);
              if ((long)uVar6 < 0) goto LAB_00144b52;
              iVar11 = *(int *)(pcVar4 + uVar6);
            } while (iVar21 <= iVar11 / 2);
            if (iVar21 <= iVar11) {
              puVar22 = (uint *)(pcVar4 + uVar6);
              *(undefined4 *)(pcVar4 + uVar19 + 4) = *(undefined4 *)(pcVar4 + uVar6 + 4);
              goto LAB_00144bf2;
            }
          }
        }
LAB_00144b52:
        lVar14 = lVar14 + 1;
      } while (lVar14 != pool->block_count);
    }
    iVar5 = pool->current_block;
    puVar22 = (uint *)psVar3[iVar5].tail;
    iVar11 = iVar21;
    if ((*(int *)&psVar3[iVar5].data - (int)puVar22) + psVar3[iVar5].capacity < iVar21) {
      iVar5 = pool->block_size;
      if (pool->block_size < iVar21) {
        iVar5 = iVar21;
      }
      iVar5 = strpool_internal_add_block(pool,iVar5);
      pool->current_block = iVar5;
      puVar22 = (uint *)pool->blocks[iVar5].tail;
      pool->blocks[iVar5].tail = (char *)((long)iVar21 + (long)puVar22);
    }
    else {
      psVar3[iVar5].tail = (char *)((long)iVar21 + (long)puVar22);
    }
LAB_00144bf2:
    psVar8->hash_slot = uVar20;
    psVar8->handle_index = local_68;
    psVar8->data = (char *)puVar22;
    psVar8->size = iVar11;
    psVar8->length = length;
    psVar8->refcount = 0;
    *puVar22 = uVar23;
    puVar22[1] = length;
    memcpy(puVar22 + 2,string,__n);
    *(char *)((long)puVar22 + __n + 8) = '\0';
    psVar9 = pool->handles + lVar18;
LAB_00144c4e:
    uVar10 = (long)(local_68 + 1) & pool->index_mask |
             ((long)psVar9->counter & pool->counter_mask) << ((byte)pool->counter_shift & 0x3f);
  }
  return uVar10;
}

Assistant:

STRPOOL_U64 strpool_inject( strpool_t* pool, char const* string, int length )
    {
    if( !string || length <= 0 ) return 0;

    STRPOOL_U32 hash = strpool_internal_find_in_blocks( pool, string, length );
    // If no stored hash, calculate it from data
    if( !hash ) hash = strpool_internal_calculate_hash( string, length, pool->ignore_case ); 

    // Return handle to existing string, if it is already in pool
    int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
    int base_count = pool->hash_table[ base_slot ].base_count;
    int slot = base_slot;
    int first_free = slot;
    while( base_count > 0 )
        {
        STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
        if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
        int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        if( slot_base == base_slot ) 
            {
            STRPOOL_ASSERT( base_count > 0, "Invalid base count" );
            --base_count;
            if( slot_hash == hash )
                {
                int index = pool->hash_table[ slot ].entry_index;
                strpool_internal_entry_t* entry = &pool->entries[ index ];
                if( entry->length == length && 
                    ( 
                       ( !pool->ignore_case &&   STRPOOL_MEMCMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 )
                    || (  pool->ignore_case && STRPOOL_STRNICMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 ) 
                    ) 
                  )
                    {
                    int handle_index = entry->handle_index;
                    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, 
                        pool->index_mask, pool->counter_shift, pool->counter_mask );
                    }
                }
            }
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
        }   

    // This is a new string, so let's add it

    if( pool->entry_count >= ( pool->hash_capacity  - pool->hash_capacity / 3 ) )
        {
        strpool_internal_expand_hash_table( pool );

        base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        slot = base_slot;
        first_free = slot;
        while( base_count )
            {
            STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
            if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
            int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            if( slot_base == base_slot )  --base_count;
            slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            }       
        }
        
    slot = first_free;
    while( pool->hash_table[ slot ].hash_key )
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );

    if( pool->entry_count >= pool->entry_capacity )
        strpool_internal_expand_entries( pool );

    STRPOOL_ASSERT( !pool->hash_table[ slot ].hash_key && ( hash & ( (STRPOOL_U32) pool->hash_capacity - 1 ) ) == (STRPOOL_U32) base_slot, "Invalid slot" );
    STRPOOL_ASSERT( hash, "Invalid hash" );
    pool->hash_table[ slot ].hash_key = hash;
    pool->hash_table[ slot ].entry_index = pool->entry_count;
    ++pool->hash_table[ base_slot ].base_count;

    int handle_index;

    if( pool->handle_count < pool->handle_capacity )
        {
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }
    else if( pool->handle_freelist_head >= 0 )
        {
        handle_index = pool->handle_freelist_head;
        if( pool->handle_freelist_tail == pool->handle_freelist_head ) 
            pool->handle_freelist_tail = pool->handles[ pool->handle_freelist_head ].entry_index;
        pool->handle_freelist_head = pool->handles[ pool->handle_freelist_head ].entry_index;                       
        }
    else
        {
        strpool_internal_expand_handles( pool );
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }

    pool->handles[ handle_index ].entry_index = pool->entry_count;
        
    strpool_internal_entry_t* entry = &pool->entries[ pool->entry_count ];
    ++pool->entry_count;
        
    int data_size = length + 1 + (int) ( 2 * sizeof( STRPOOL_U32 ) );
    char* data = strpool_internal_get_data_storage( pool, data_size, &data_size );
    entry->hash_slot = slot;
    entry->handle_index = handle_index;
    entry->data = data;
    entry->size = data_size;
    entry->length = length;
    entry->refcount = 0;

    *(STRPOOL_U32*)(data) = hash;
    data += sizeof( STRPOOL_U32 );
    *(STRPOOL_U32*)(data) = (STRPOOL_U32) length;
    data += sizeof( STRPOOL_U32 );
    STRPOOL_MEMCPY( data, string, (size_t) length ); 
    data[ length ] = 0; // Ensure trailing zero

    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, pool->index_mask, 
        pool->counter_shift, pool->counter_mask );
    }